

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O2

void Z80::OpCode_Next_NEXTREG(void)

{
  byte bVar1;
  bool bVar2;
  char cVar3;
  Z80Reg ZVar4;
  EStatus type;
  undefined1 signedCheck;
  undefined8 in_RSI;
  char *badValueMessage;
  char **in_RDI;
  char **p;
  char *message;
  int local_48 [6];
  
  if (DAT_0018a51c < 1) {
    Error("Z80N instructions are currently disabled",bp,SUPPRESS);
    return;
  }
  do {
    signedCheck = (undefined1)in_RSI;
    local_48[0] = -1;
    local_48[1] = -1;
    local_48[2] = 0xffffffff;
    local_48[3] = 0xffffffff;
    local_48[4] = 0xffffffff;
    ZVar4 = GetRegister(in_RDI);
    if (ZVar4 != Z80_UNK) {
      message = "[NEXTREG] first operand should be register number";
      badValueMessage = ::line;
      type = SUPPRESS;
LAB_00134c77:
      Error(message,badValueMessage,type);
      return;
    }
    bVar1 = GetByteNoMem((char **)0x0,(bool)signedCheck);
    local_48[2] = (int)bVar1;
    Relocation::checkAndWarn(false);
    p = &lp;
    bVar2 = comma(&lp);
    if (!bVar2) {
      message = "[NEXTREG] Comma expected";
      type = PASS3;
      badValueMessage = (char *)0x0;
      goto LAB_00134c77;
    }
    ZVar4 = GetRegister(p);
    if (ZVar4 == Z80_UNK) {
      local_48[0] = 0xed;
      local_48[1] = 0x91;
      bVar1 = GetByteNoMem((char **)0x0,(bool)signedCheck);
      local_48[3] = (int)bVar1;
      resolveRelocationAndSmartSmc(3,HIGH);
    }
    else if (ZVar4 == Z80_A) {
      local_48[0] = 0xed;
      local_48[1] = 0x92;
    }
    in_RSI = 1;
    EmitBytes(local_48,true);
    in_RDI = &lp;
    cVar3 = (*DAT_0018a520)();
    if (cVar3 == '\0') {
      return;
    }
  } while( true );
}

Assistant:

static void OpCode_Next_NEXTREG() {
		if (Options::syx.IsNextEnabled < 1) {
			Error("Z80N instructions are currently disabled", bp, SUPPRESS);
			return;
		}
		Z80Reg reg;
		int e[5];
		do {
			e[0] = e[1] = e[2] = e[3] = e[4] = -1;
			// is operand1 register? (to give more precise error message to people using wrong `nextreg a,$nn`)
			reg = GetRegister(lp);
			if (Z80_UNK != reg) {
				Error("[NEXTREG] first operand should be register number", line, SUPPRESS); break;
			}
			// this code would be enough to get correct assembling, the test above is "extra"
			e[2] = GetByteNoMem(lp);
			Relocation::checkAndWarn();		// display warning if register number is trying to be relocatable (impossible)
			if (!comma(lp)) {
				Error("[NEXTREG] Comma expected"); break;
			}
			switch (reg = GetRegister(lp)) {
				case Z80_A:
					e[0] = 0xED; e[1] = 0x92;
					break;
				case Z80_UNK:
					e[0] = 0xED; e[1] = 0x91;
					e[3] = GetByteNoMem(lp);
					resolveRelocationAndSmartSmc(3, Relocation::HIGH);
					break;
				default:
					break;
			}
			EmitBytes(e, true);
		} while (Options::syx.MultiArg(lp));
	}